

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::BuildBLAS(DeviceContextVkImpl *this,BuildBLASAttribs *Attribs)

{
  Uint32 *pUVar1;
  atomic<unsigned_int> *paVar2;
  BLASBuildTriangleData *pBVar3;
  BLASTriangleDesc *pBVar4;
  BLASBuildBoundingBoxData *pBVar5;
  pointer pVVar6;
  uint uVar7;
  Uint32 UVar8;
  VkGeometryFlagsKHR VVar9;
  VkFormat VVar10;
  int iVar11;
  Uint32 UVar12;
  VkIndexType VVar13;
  VkBuildAccelerationStructureFlagsKHR VVar14;
  BottomLevelASVkImpl *BLAS;
  BufferVkImpl *Buffer;
  BufferVkImpl *pBVar15;
  VkDeviceAddress VVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  Uint32 i;
  pointer pVVar21;
  VkAccelerationStructureBuildRangeInfoKHR *VkRangePtr;
  BuildBLASAttribs *local_110;
  string msg;
  vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  vkGeometries;
  vector<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
  vkRanges;
  VkAccelerationStructureBuildGeometryInfoKHR vkASBuildInfo;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::BuildBLAS
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  BLAS = ClassPtrCast<Diligent::BottomLevelASVkImpl,Diligent::IBottomLevelAS>(Attribs->pBLAS);
  Buffer = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(Attribs->pScratchBuffer);
  EnsureVkCmdBuffer(this);
  TransitionOrVerifyBLASState
            (this,BLAS,Attribs->BLASTransitionMode,RESOURCE_STATE_BUILD_AS_WRITE,
             "Build BottomLevelAS (DeviceContextVkImpl::BuildBLAS)");
  TransitionOrVerifyBufferState
            (this,Buffer,Attribs->ScratchBufferTransitionMode,RESOURCE_STATE_BUILD_AS_WRITE,
             VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR,
             "Build BottomLevelAS (DeviceContextVkImpl::BuildBLAS)");
  vkASBuildInfo.ppGeometries = (VkAccelerationStructureGeometryKHR **)0x0;
  vkASBuildInfo.scratchData.deviceAddress = 0;
  vkASBuildInfo.geometryCount = 0;
  vkASBuildInfo._52_4_ = 0;
  vkASBuildInfo.pGeometries = (VkAccelerationStructureGeometryKHR *)0x0;
  vkASBuildInfo.srcAccelerationStructure = (VkAccelerationStructureKHR)0x0;
  vkASBuildInfo.dstAccelerationStructure = (VkAccelerationStructureKHR)0x0;
  vkASBuildInfo.type = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;
  vkASBuildInfo.flags = 0;
  vkASBuildInfo.mode = VK_BUILD_ACCELERATION_STRUCTURE_MODE_BUILD_KHR;
  vkASBuildInfo._28_4_ = 0;
  vkRanges.
  super__Vector_base<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vkASBuildInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vkASBuildInfo._4_4_ = 0;
  vkASBuildInfo.pNext = (void *)0x0;
  vkGeometries.
  super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vkRanges.
  super__Vector_base<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vkRanges.
  super__Vector_base<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vkGeometries.
  super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vkGeometries.
  super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110 = Attribs;
  if (Attribs->pTriangleData == (BLASBuildTriangleData *)0x0) {
    if (Attribs->pBoxData != (BLASBuildBoundingBoxData *)0x0) {
      std::
      vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
      ::resize(&vkGeometries,(ulong)Attribs->BoxDataCount);
      std::
      vector<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
      ::resize(&vkRanges,(ulong)Attribs->BoxDataCount);
      uVar7 = Attribs->BoxDataCount;
      (BLAS->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).m_GeometryCount = uVar7;
      lVar19 = 0x20;
      for (uVar18 = 0; uVar18 < uVar7; uVar18 = uVar18 + 1) {
        pBVar5 = Attribs->pBoxData;
        VkRangePtr = (VkAccelerationStructureBuildRangeInfoKHR *)
                     CONCAT44(VkRangePtr._4_4_,(int)uVar18);
        UVar8 = BottomLevelASBase<Diligent::EngineVkImplTraits>::UpdateGeometryIndex
                          (&BLAS->super_BottomLevelASBase<Diligent::EngineVkImplTraits>,
                           *(char **)((long)pBVar5 + lVar19 + -0x20),(Uint32 *)&VkRangePtr,
                           Attribs->Update);
        pVVar6 = vkGeometries.
                 super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((int)VkRangePtr == -1 || UVar8 == 0xffffffff) {
          FormatString<char[32]>(&msg,(char (*) [32])"Failed to find geometry by name");
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"BuildBLAS",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0xe28);
          std::__cxx11::string::~string((string *)&msg);
        }
        else {
          uVar20 = (ulong)VkRangePtr & 0xffffffff;
          pVVar21 = vkRanges.
                    super__Vector_base<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar20;
          vkGeometries.
          super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar20].sType =
               VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
          vkGeometries.
          super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar20].pNext = (void *)0x0;
          VVar9 = GeometryFlagsToVkGeometryFlags
                            (*(RAYTRACING_GEOMETRY_FLAGS *)((long)&pBVar5->GeometryName + lVar19));
          pVVar6[uVar20].flags = VVar9;
          pVVar6[uVar20].geometryType = VK_GEOMETRY_TYPE_AABBS_KHR;
          pBVar15 = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>
                              (*(IBuffer **)((long)pBVar5 + lVar19 + -0x18));
          pVVar6[uVar20].geometry.triangles.sType =
               VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_AABBS_DATA_KHR;
          pVVar6[uVar20].geometry.triangles.pNext = (void *)0x0;
          *(ulong *)((long)&pVVar6[uVar20].geometry + 0x18) =
               (ulong)*(uint *)((long)pBVar5 + lVar19 + -8);
          VVar16 = BufferVkImpl::GetVkDeviceAddress(pBVar15);
          uVar17 = VVar16 + *(long *)((long)pBVar5 + lVar19 + -0x10);
          *(ulong *)((long)&pVVar6[uVar20].geometry + 0x10) = uVar17;
          if ((uVar17 & 7) != 0) {
            FormatString<char[43]>(&msg,(char (*) [43])"AABB start address is not properly aligned")
            ;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"BuildBLAS",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0xe3c);
            std::__cxx11::string::~string((string *)&msg);
          }
          TransitionOrVerifyBufferState
                    (this,pBVar15,local_110->GeometryTransitionMode,RESOURCE_STATE_BUILD_AS_READ,
                     VK_ACCESS_SHADER_READ_BIT,
                     "Build BottomLevelAS (DeviceContextVkImpl::BuildBLAS)");
          pVVar21->transformOffset = 0;
          pVVar21->primitiveOffset = 0;
          pVVar21->firstVertex = 0;
          pVVar21->primitiveCount = *(uint32_t *)((long)pBVar5 + lVar19 + -4);
          Attribs = local_110;
        }
        uVar7 = Attribs->BoxDataCount;
        lVar19 = lVar19 + 0x28;
      }
    }
  }
  else {
    std::
    vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
    ::resize(&vkGeometries,(ulong)Attribs->TriangleDataCount);
    std::
    vector<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
    ::resize(&vkRanges,(ulong)Attribs->TriangleDataCount);
    uVar7 = Attribs->TriangleDataCount;
    (BLAS->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).m_GeometryCount = uVar7;
    lVar19 = 0x50;
    for (uVar18 = 0; uVar18 < uVar7; uVar18 = uVar18 + 1) {
      pBVar3 = Attribs->pTriangleData;
      VkRangePtr = (VkAccelerationStructureBuildRangeInfoKHR *)
                   CONCAT44(VkRangePtr._4_4_,(int)uVar18);
      UVar8 = BottomLevelASBase<Diligent::EngineVkImplTraits>::UpdateGeometryIndex
                        (&BLAS->super_BottomLevelASBase<Diligent::EngineVkImplTraits>,
                         *(char **)((long)pBVar3 + lVar19 + -0x50),(Uint32 *)&VkRangePtr,
                         Attribs->Update);
      pVVar6 = vkGeometries.
               super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((int)VkRangePtr == -1 || UVar8 == 0xffffffff) {
        FormatString<char[32]>(&msg,(char (*) [32])"Failed to find geometry by name");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"BuildBLAS",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xdd2);
        Attribs = local_110;
        std::__cxx11::string::~string((string *)&msg);
      }
      else {
        uVar17 = (ulong)VkRangePtr & 0xffffffff;
        pVVar21 = vkRanges.
                  super__Vector_base<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar17;
        pBVar4 = (BLAS->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
                 super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                 .m_Desc.pTriangles;
        vkGeometries.
        super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar17].sType =
             VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
        vkGeometries.
        super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar17].pNext = (void *)0x0;
        VVar9 = GeometryFlagsToVkGeometryFlags
                          (*(RAYTRACING_GEOMETRY_FLAGS *)((long)&pBVar3->GeometryName + lVar19));
        pVVar6[uVar17].flags = VVar9;
        pVVar6[uVar17].geometryType = VK_GEOMETRY_TYPE_TRIANGLES_KHR;
        pVVar6[uVar17].geometry.triangles.sType =
             VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_TRIANGLES_DATA_KHR;
        pVVar6[uVar17].geometry.triangles.pNext = (void *)0x0;
        pBVar15 = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>
                            (*(IBuffer **)((long)pBVar3 + lVar19 + -0x48));
        VVar10 = TypeToVkFormat(pBVar4[UVar8].VertexValueType,
                                (uint)pBVar4[UVar8].VertexComponentCount,
                                pBVar4[UVar8].VertexValueType < VT_FLOAT16);
        pVVar6[uVar17].geometry.triangles.vertexFormat = VVar10;
        *(ulong *)((long)&pVVar6[uVar17].geometry + 0x20) =
             (ulong)*(uint *)((long)pBVar3 + lVar19 + -0x38);
        iVar11 = *(int *)((long)pBVar3 + lVar19 + -0x34);
        if (iVar11 == 0) {
          FormatString<char[36]>(&msg,(char (*) [36])"Vertex count must be greater than 0");
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"BuildBLAS",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0xde8);
          std::__cxx11::string::~string((string *)&msg);
          iVar11 = *(int *)((long)pBVar3 + lVar19 + -0x34);
        }
        pVVar6[uVar17].geometry.triangles.maxVertex = iVar11 - 1;
        VVar16 = BufferVkImpl::GetVkDeviceAddress(pBVar15);
        uVar20 = VVar16 + *(long *)((long)pBVar3 + lVar19 + -0x40);
        pVVar6[uVar17].geometry.aabbs.stride = uVar20;
        UVar12 = GetValueSize(pBVar4[UVar8].VertexValueType);
        if (uVar20 % (ulong)UVar12 != 0) {
          FormatString<char[52]>
                    (&msg,(char (*) [52])"Vertex buffer start address is not properly aligned");
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"BuildBLAS",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0xded);
          std::__cxx11::string::~string((string *)&msg);
        }
        TransitionOrVerifyBufferState
                  (this,pBVar15,local_110->GeometryTransitionMode,RESOURCE_STATE_BUILD_AS_READ,
                   VK_ACCESS_SHADER_READ_BIT,"Build BottomLevelAS (DeviceContextVkImpl::BuildBLAS)")
        ;
        pBVar15 = *(BufferVkImpl **)((long)pBVar3 + lVar19 + -0x28);
        if (pBVar15 == (BufferVkImpl *)0x0) {
          pVVar6[uVar17].geometry.triangles.indexType = VK_INDEX_TYPE_NONE_KHR;
          pVVar6[uVar17].geometry.triangles.indexData.deviceAddress = 0;
        }
        else {
          CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>((IBuffer *)pBVar15);
          VVar13 = TypeToVkIndexType(pBVar4[UVar8].IndexType);
          pVVar6[uVar17].geometry.triangles.indexType = VVar13;
          VVar16 = BufferVkImpl::GetVkDeviceAddress(pBVar15);
          uVar20 = VVar16 + *(long *)((long)pBVar3 + lVar19 + -0x20);
          *(ulong *)((long)&pVVar6[uVar17].geometry + 0x30) = uVar20;
          UVar8 = GetValueSize(pBVar4[UVar8].IndexType);
          if (uVar20 % (ulong)UVar8 != 0) {
            FormatString<char[51]>
                      (&msg,(char (*) [51])"Index buffer start address is not properly aligned");
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"BuildBLAS",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0xdfa);
            std::__cxx11::string::~string((string *)&msg);
          }
          TransitionOrVerifyBufferState
                    (this,pBVar15,local_110->GeometryTransitionMode,RESOURCE_STATE_BUILD_AS_READ,
                     VK_ACCESS_SHADER_READ_BIT,
                     "Build BottomLevelAS (DeviceContextVkImpl::BuildBLAS)");
        }
        pBVar15 = *(BufferVkImpl **)((long)pBVar3 + lVar19 + -0x10);
        if (pBVar15 == (BufferVkImpl *)0x0) {
          pVVar6[uVar17].geometry.triangles.transformData.deviceAddress = 0;
        }
        else {
          CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>((IBuffer *)pBVar15);
          VVar16 = BufferVkImpl::GetVkDeviceAddress(pBVar15);
          pVVar6[uVar17].geometry.triangles.transformData.hostAddress =
               (void *)(VVar16 + *(long *)((long)pBVar3 + lVar19 + -8));
          if ((*(byte *)((long)&pVVar6[uVar17].geometry + 0x30) & 0xf) != 0) {
            FormatString<char[55]>
                      (&msg,(char (*) [55])"Transform buffer start address is not properly aligned")
            ;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"BuildBLAS",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0xe0a);
            std::__cxx11::string::~string((string *)&msg);
          }
          TransitionOrVerifyBufferState
                    (this,pBVar15,local_110->GeometryTransitionMode,RESOURCE_STATE_BUILD_AS_READ,
                     VK_ACCESS_SHADER_READ_BIT,
                     "Build BottomLevelAS (DeviceContextVkImpl::BuildBLAS)");
        }
        pVVar21->primitiveCount = *(uint32_t *)((long)pBVar3 + lVar19 + -0x2c);
        pVVar21->primitiveOffset = 0;
        pVVar21->firstVertex = 0;
        pVVar21->transformOffset = 0;
        Attribs = local_110;
      }
      uVar7 = Attribs->TriangleDataCount;
      lVar19 = lVar19 + 0x58;
    }
  }
  VkRangePtr = vkRanges.
               super__Vector_base<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
               ._M_impl.super__Vector_impl_data._M_start;
  vkASBuildInfo.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_GEOMETRY_INFO_KHR;
  vkASBuildInfo.type = VK_ACCELERATION_STRUCTURE_TYPE_BOTTOM_LEVEL_KHR;
  VVar14 = BuildASFlagsToVkBuildAccelerationStructureFlags
                     ((BLAS->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                      .m_Desc.Flags);
  vkASBuildInfo.flags = VVar14;
  vkASBuildInfo.mode = (uint)Attribs->Update;
  vkASBuildInfo.dstAccelerationStructure = (BLAS->m_VulkanBLAS).m_VkObject;
  vkASBuildInfo.srcAccelerationStructure = (VkAccelerationStructureKHR_T *)0x0;
  if (Attribs->Update != VK_BUILD_ACCELERATION_STRUCTURE_MODE_BUILD_KHR) {
    vkASBuildInfo.srcAccelerationStructure = vkASBuildInfo.dstAccelerationStructure;
  }
  vkASBuildInfo.geometryCount =
       (uint32_t)
       (((long)vkGeometries.
               super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)vkGeometries.
              super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x60);
  vkASBuildInfo.pGeometries =
       vkGeometries.
       super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
       ._M_impl.super__Vector_impl_data._M_start;
  vkASBuildInfo.ppGeometries = (VkAccelerationStructureGeometryKHR **)0x0;
  VVar16 = BufferVkImpl::GetVkDeviceAddress(Buffer);
  vkASBuildInfo.scratchData.hostAddress = (void *)(VVar16 + Attribs->ScratchBufferOffset);
  if (vkASBuildInfo.scratchData.deviceAddress %
      (ulong)*(uint32_t *)
              ((long)&(((((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject)
                        ->m_PhysicalDevice)._M_t.
                        super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                        .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>.
                       _M_head_impl)->m_ExtProperties).AccelStruct + 0x38) != 0) {
    FormatString<char[53]>
              (&msg,(char (*) [53])"Scratch buffer start address is not properly aligned");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BuildBLAS",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xe55);
    std::__cxx11::string::~string((string *)&msg);
  }
  EnsureVkCmdBuffer(this);
  VulkanUtilities::VulkanCommandBuffer::BuildAccelerationStructure
            (&this->m_CommandBuffer,1,&vkASBuildInfo,&VkRangePtr);
  pUVar1 = &(this->m_State).NumCommands;
  *pUVar1 = *pUVar1 + 1;
  LOCK();
  paVar2 = &(BLAS->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).m_DvpVersion;
  (paVar2->super___atomic_base<unsigned_int>)._M_i =
       (paVar2->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  std::
  _Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  ::~_Vector_base(&vkGeometries.
                   super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                 );
  std::
  _Vector_base<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
  ::~_Vector_base(&vkRanges.
                   super__Vector_base<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
                 );
  return;
}

Assistant:

void DeviceContextVkImpl::BuildBLAS(const BuildBLASAttribs& Attribs)
{
    TDeviceContextBase::BuildBLAS(Attribs, 0);

    BottomLevelASVkImpl*     pBLASVk    = ClassPtrCast<BottomLevelASVkImpl>(Attribs.pBLAS);
    BufferVkImpl*            pScratchVk = ClassPtrCast<BufferVkImpl>(Attribs.pScratchBuffer);
    const BottomLevelASDesc& BLASDesc   = pBLASVk->GetDesc();

    EnsureVkCmdBuffer();

    const char* OpName = "Build BottomLevelAS (DeviceContextVkImpl::BuildBLAS)";
    TransitionOrVerifyBLASState(*pBLASVk, Attribs.BLASTransitionMode, RESOURCE_STATE_BUILD_AS_WRITE, OpName);
    TransitionOrVerifyBufferState(*pScratchVk, Attribs.ScratchBufferTransitionMode, RESOURCE_STATE_BUILD_AS_WRITE, VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR, OpName);

    VkAccelerationStructureBuildGeometryInfoKHR           vkASBuildInfo = {};
    std::vector<VkAccelerationStructureBuildRangeInfoKHR> vkRanges;
    std::vector<VkAccelerationStructureGeometryKHR>       vkGeometries;

    if (Attribs.pTriangleData != nullptr)
    {
        vkGeometries.resize(Attribs.TriangleDataCount);
        vkRanges.resize(Attribs.TriangleDataCount);
        pBLASVk->SetActualGeometryCount(Attribs.TriangleDataCount);

        for (Uint32 i = 0; i < Attribs.TriangleDataCount; ++i)
        {
            const BLASBuildTriangleData& SrcTris = Attribs.pTriangleData[i];

            Uint32 Idx    = i;
            Uint32 GeoIdx = pBLASVk->UpdateGeometryIndex(SrcTris.GeometryName, Idx, Attribs.Update);

            if (GeoIdx == INVALID_INDEX || Idx == INVALID_INDEX)
            {
                UNEXPECTED("Failed to find geometry by name");
                continue;
            }

            VkAccelerationStructureGeometryKHR&              vkGeo   = vkGeometries[Idx];
            VkAccelerationStructureGeometryTrianglesDataKHR& vkTris  = vkGeo.geometry.triangles;
            VkAccelerationStructureBuildRangeInfoKHR&        off     = vkRanges[Idx];
            const BLASTriangleDesc&                          TriDesc = BLASDesc.pTriangles[GeoIdx];

            vkGeo.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
            vkGeo.pNext        = nullptr;
            vkGeo.flags        = GeometryFlagsToVkGeometryFlags(SrcTris.Flags);
            vkGeo.geometryType = VK_GEOMETRY_TYPE_TRIANGLES_KHR;
            vkTris.sType       = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_TRIANGLES_DATA_KHR;
            vkTris.pNext       = nullptr;

            BufferVkImpl* const pVB = ClassPtrCast<BufferVkImpl>(SrcTris.pVertexBuffer);

            // vertex format in SrcTris may be undefined, so use vertex format from description
            vkTris.vertexFormat = TypeToVkFormat(TriDesc.VertexValueType, TriDesc.VertexComponentCount, TriDesc.VertexValueType < VT_FLOAT16);
            vkTris.vertexStride = SrcTris.VertexStride;
            // maxVertex is the number of vertices in vertexData minus one.
            VERIFY(SrcTris.VertexCount > 0, "Vertex count must be greater than 0");
            vkTris.maxVertex                = SrcTris.VertexCount - 1;
            vkTris.vertexData.deviceAddress = pVB->GetVkDeviceAddress() + SrcTris.VertexOffset;

            // geometry.triangles.vertexData.deviceAddress must be aligned to the size in bytes of the smallest component of the format in vertexFormat
            VERIFY(vkTris.vertexData.deviceAddress % GetValueSize(TriDesc.VertexValueType) == 0, "Vertex buffer start address is not properly aligned");

            TransitionOrVerifyBufferState(*pVB, Attribs.GeometryTransitionMode, RESOURCE_STATE_BUILD_AS_READ, VK_ACCESS_SHADER_READ_BIT, OpName);

            if (SrcTris.pIndexBuffer)
            {
                BufferVkImpl* const pIB = ClassPtrCast<BufferVkImpl>(SrcTris.pIndexBuffer);

                // index type in SrcTris may be undefined, so use index type from description
                vkTris.indexType               = TypeToVkIndexType(TriDesc.IndexType);
                vkTris.indexData.deviceAddress = pIB->GetVkDeviceAddress() + SrcTris.IndexOffset;

                // geometry.triangles.indexData.deviceAddress must be aligned to the size in bytes of the type in indexType
                VERIFY(vkTris.indexData.deviceAddress % GetValueSize(TriDesc.IndexType) == 0, "Index buffer start address is not properly aligned");

                TransitionOrVerifyBufferState(*pIB, Attribs.GeometryTransitionMode, RESOURCE_STATE_BUILD_AS_READ, VK_ACCESS_SHADER_READ_BIT, OpName);
            }
            else
            {
                vkTris.indexType               = VK_INDEX_TYPE_NONE_KHR;
                vkTris.indexData.deviceAddress = 0;
            }

            if (SrcTris.pTransformBuffer)
            {
                BufferVkImpl* const pTB            = ClassPtrCast<BufferVkImpl>(SrcTris.pTransformBuffer);
                vkTris.transformData.deviceAddress = pTB->GetVkDeviceAddress() + SrcTris.TransformBufferOffset;

                // If geometry.triangles.transformData.deviceAddress is not 0, it must be aligned to 16 bytes
                VERIFY(vkTris.indexData.deviceAddress % 16 == 0, "Transform buffer start address is not properly aligned");

                TransitionOrVerifyBufferState(*pTB, Attribs.GeometryTransitionMode, RESOURCE_STATE_BUILD_AS_READ, VK_ACCESS_SHADER_READ_BIT, OpName);
            }
            else
            {
                vkTris.transformData.deviceAddress = 0;
            }

            off.primitiveCount  = SrcTris.PrimitiveCount;
            off.firstVertex     = 0;
            off.primitiveOffset = 0;
            off.transformOffset = 0;
        }
    }
    else if (Attribs.pBoxData != nullptr)
    {
        vkGeometries.resize(Attribs.BoxDataCount);
        vkRanges.resize(Attribs.BoxDataCount);
        pBLASVk->SetActualGeometryCount(Attribs.BoxDataCount);

        for (Uint32 i = 0; i < Attribs.BoxDataCount; ++i)
        {
            const BLASBuildBoundingBoxData& SrcBoxes = Attribs.pBoxData[i];

            Uint32 Idx    = i;
            Uint32 GeoIdx = pBLASVk->UpdateGeometryIndex(SrcBoxes.GeometryName, Idx, Attribs.Update);

            if (GeoIdx == INVALID_INDEX || Idx == INVALID_INDEX)
            {
                UNEXPECTED("Failed to find geometry by name");
                continue;
            }

            VkAccelerationStructureGeometryKHR&          vkGeo   = vkGeometries[Idx];
            VkAccelerationStructureGeometryAabbsDataKHR& vkAABBs = vkGeo.geometry.aabbs;
            VkAccelerationStructureBuildRangeInfoKHR&    off     = vkRanges[Idx];

            vkGeo.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
            vkGeo.pNext        = nullptr;
            vkGeo.flags        = GeometryFlagsToVkGeometryFlags(SrcBoxes.Flags);
            vkGeo.geometryType = VK_GEOMETRY_TYPE_AABBS_KHR;

            BufferVkImpl* const pBB    = ClassPtrCast<BufferVkImpl>(SrcBoxes.pBoxBuffer);
            vkAABBs.sType              = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_AABBS_DATA_KHR;
            vkAABBs.pNext              = nullptr;
            vkAABBs.stride             = SrcBoxes.BoxStride;
            vkAABBs.data.deviceAddress = pBB->GetVkDeviceAddress() + SrcBoxes.BoxOffset;

            // geometry.aabbs.data.deviceAddress must be aligned to 8 bytes
            VERIFY(vkAABBs.data.deviceAddress % 8 == 0, "AABB start address is not properly aligned");

            TransitionOrVerifyBufferState(*pBB, Attribs.GeometryTransitionMode, RESOURCE_STATE_BUILD_AS_READ, VK_ACCESS_SHADER_READ_BIT, OpName);

            off.firstVertex     = 0;
            off.transformOffset = 0;
            off.primitiveOffset = 0;
            off.primitiveCount  = SrcBoxes.BoxCount;
        }
    }

    VkAccelerationStructureBuildRangeInfoKHR const* VkRangePtr = vkRanges.data();

    vkASBuildInfo.sType                     = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_GEOMETRY_INFO_KHR;
    vkASBuildInfo.type                      = VK_ACCELERATION_STRUCTURE_TYPE_BOTTOM_LEVEL_KHR;                 // type must be compatible with create info
    vkASBuildInfo.flags                     = BuildASFlagsToVkBuildAccelerationStructureFlags(BLASDesc.Flags); // flags must be compatible with create info
    vkASBuildInfo.mode                      = Attribs.Update ? VK_BUILD_ACCELERATION_STRUCTURE_MODE_UPDATE_KHR : VK_BUILD_ACCELERATION_STRUCTURE_MODE_BUILD_KHR;
    vkASBuildInfo.srcAccelerationStructure  = Attribs.Update ? pBLASVk->GetVkBLAS() : VK_NULL_HANDLE;
    vkASBuildInfo.dstAccelerationStructure  = pBLASVk->GetVkBLAS();
    vkASBuildInfo.geometryCount             = static_cast<uint32_t>(vkGeometries.size());
    vkASBuildInfo.pGeometries               = vkGeometries.data();
    vkASBuildInfo.ppGeometries              = nullptr;
    vkASBuildInfo.scratchData.deviceAddress = pScratchVk->GetVkDeviceAddress() + Attribs.ScratchBufferOffset;

    const VkPhysicalDeviceAccelerationStructurePropertiesKHR& ASLimits = m_pDevice->GetPhysicalDevice().GetExtProperties().AccelStruct;
    VERIFY(vkASBuildInfo.scratchData.deviceAddress % ASLimits.minAccelerationStructureScratchOffsetAlignment == 0, "Scratch buffer start address is not properly aligned");

    EnsureVkCmdBuffer();
    m_CommandBuffer.BuildAccelerationStructure(1, &vkASBuildInfo, &VkRangePtr);
    ++m_State.NumCommands;

#ifdef DILIGENT_DEVELOPMENT
    pBLASVk->DvpUpdateVersion();
#endif
}